

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O0

string_view __thiscall slang::SourceManager::getRawFileName(SourceManager *this,BufferID buffer)

{
  FileInfo *__str;
  mutex_type *in_RDI;
  string_view sVar1;
  FileInfo *info;
  shared_lock<std::shared_mutex> lock;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  shared_lock<std::shared_mutex> *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  BufferID in_stack_ffffffffffffffbc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  __sv_type local_10;
  
  this_00 = &local_30;
  std::shared_lock<std::shared_mutex>::shared_lock((shared_lock<std::shared_mutex> *)this_00,in_RDI)
  ;
  __str = getFileInfo<std::shared_lock<std::shared_mutex>_>
                    ((SourceManager *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                     in_stack_ffffffffffffffbc,in_stack_ffffffffffffffa8);
  if ((__str == (FileInfo *)0x0) || (__str->data == (FileData *)0x0)) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),(char *)__str);
  }
  else {
    local_10 = std::__cxx11::string::operator_cast_to_basic_string_view(this_00);
  }
  std::shared_lock<std::shared_mutex>::~shared_lock((shared_lock<std::shared_mutex> *)this_00);
  sVar1._M_len = local_10._M_len;
  sVar1._M_str = local_10._M_str;
  return sVar1;
}

Assistant:

std::string_view SourceManager::getRawFileName(BufferID buffer) const {
    std::shared_lock<std::shared_mutex> lock(mutex);
    auto info = getFileInfo(buffer, lock);
    if (!info || !info->data)
        return "";

    return info->data->name;
}